

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O3

Relations * __thiscall dg::vr::Relations::addImplied(Relations *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->bits).super__Base_bitset<1UL>._M_w;
  uVar3 = uVar1 | 0x154;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1;
  }
  uVar5 = uVar3 | 6;
  if ((uVar3 & 8) == 0) {
    uVar5 = uVar3;
  }
  uVar4 = uVar5 | 0x12;
  if ((uVar5 & 0x20) == 0) {
    uVar4 = uVar5;
  }
  uVar2 = uVar4 | 0x42;
  if ((uVar4 & 0x80) == 0) {
    uVar2 = uVar4;
  }
  if (((((uVar1 & 1) != 0 || (uVar3 & 8) != 0) || (uVar5 & 0x20) != 0) || (uVar4 & 0x80) != 0) ||
      (uVar2 & 0x200) != 0) {
    uVar1 = uVar2 | 0x102;
    if ((uVar2 & 0x200) == 0) {
      uVar1 = uVar2;
    }
    (this->bits).super__Base_bitset<1UL>._M_w = uVar1;
  }
  return this;
}

Assistant:

Relations &Relations::addImplied() {
    if (has(EQ))
        sle().ule().sge().uge();
    if (has(SLT))
        sle().ne();
    if (has(ULT))
        ule().ne();
    if (has(SGT))
        sge().ne();
    if (has(UGT))
        uge().ne();
    return *this;
}